

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

BoolParameter * __thiscall
CoreML::Specification::BoolParameter::New(BoolParameter *this,Arena *arena)

{
  BoolParameter *this_00;
  
  this_00 = (BoolParameter *)operator_new(0x18);
  BoolParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::BoolParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

BoolParameter* BoolParameter::New(::google::protobuf::Arena* arena) const {
  BoolParameter* n = new BoolParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}